

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O3

DeviceType Diligent::RenderDeviceTypeToArchiveDeviceType(RENDER_DEVICE_TYPE Type)

{
  DeviceType DVar1;
  uint uVar2;
  string msg;
  string local_28;
  
  uVar2 = Type - RENDER_DEVICE_TYPE_D3D11;
  if ((uVar2 < 7) && ((0x5fU >> (uVar2 & 0x1f) & 1) != 0)) {
    DVar1 = *(DeviceType *)(&DAT_0090a434 + (ulong)uVar2 * 4);
  }
  else {
    FormatString<char[23]>(&local_28,(char (*) [23])"Unexpected device type");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"RenderDeviceTypeToArchiveDeviceType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x3d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    DVar1 = Count;
  }
  return DVar1;
}

Assistant:

DeviceObjectArchive::DeviceType RenderDeviceTypeToArchiveDeviceType(RENDER_DEVICE_TYPE Type)
{
    static_assert(RENDER_DEVICE_TYPE_COUNT == 8, "Did you add a new render device type? Please handle it here.");
    switch (Type)
    {
            // clang-format off
        case RENDER_DEVICE_TYPE_D3D11:  return DeviceObjectArchive::DeviceType::Direct3D11;
        case RENDER_DEVICE_TYPE_D3D12:  return DeviceObjectArchive::DeviceType::Direct3D12;
        case RENDER_DEVICE_TYPE_GL:     return DeviceObjectArchive::DeviceType::OpenGL;
        case RENDER_DEVICE_TYPE_GLES:   return DeviceObjectArchive::DeviceType::OpenGL;
        case RENDER_DEVICE_TYPE_VULKAN: return DeviceObjectArchive::DeviceType::Vulkan;
#if PLATFORM_MACOS
        case RENDER_DEVICE_TYPE_METAL:  return DeviceObjectArchive::DeviceType::Metal_MacOS;
#elif PLATFORM_IOS || PLATFORM_TVOS
        case RENDER_DEVICE_TYPE_METAL:  return DeviceObjectArchive::DeviceType::Metal_iOS;
#endif
        case RENDER_DEVICE_TYPE_WEBGPU:
            return DeviceObjectArchive::DeviceType::WebGPU;

        // clang-format on
        default:
            UNEXPECTED("Unexpected device type");
            return DeviceObjectArchive::DeviceType::Count;
    }
}